

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

PipelineCreateInfo * __thiscall
vkt::Draw::PipelineCreateInfo::addState
          (PipelineCreateInfo *this,VkPipelineColorBlendStateCreateInfo *state)

{
  pointer pVVar1;
  pointer pVVar2;
  void *pvVar3;
  undefined8 uVar4;
  VkPipelineColorBlendStateCreateFlags VVar5;
  VkBool32 VVar6;
  VkLogicOp VVar7;
  deUint32 dVar8;
  VkStructureType VVar9;
  undefined4 uVar10;
  allocator_type local_39;
  pointer local_38;
  pointer pVStack_30;
  pointer local_28;
  
  std::
  vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
  ::vector<vk::VkPipelineColorBlendAttachmentState_const*,void>
            ((vector<vk::VkPipelineColorBlendAttachmentState,std::allocator<vk::VkPipelineColorBlendAttachmentState>>
              *)&local_38,state->pAttachments,state->pAttachments + state->attachmentCount,&local_39
            );
  pVVar1 = (this->m_colorBlendStateAttachments).
           super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->m_colorBlendStateAttachments).
           super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_colorBlendStateAttachments).
  super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_start = local_38;
  (this->m_colorBlendStateAttachments).
  super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_finish = pVStack_30;
  (this->m_colorBlendStateAttachments).
  super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
  local_38 = (pointer)0x0;
  pVStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)pVVar2 - (long)pVVar1);
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
  }
  VVar9 = state->sType;
  uVar10 = *(undefined4 *)&state->field_0x4;
  pvVar3 = state->pNext;
  VVar5 = state->flags;
  VVar6 = state->logicOpEnable;
  VVar7 = state->logicOp;
  dVar8 = state->attachmentCount;
  uVar4 = *(undefined8 *)state->blendConstants;
  (this->m_colorBlendState).pAttachments = state->pAttachments;
  *(undefined8 *)(this->m_colorBlendState).blendConstants = uVar4;
  *(undefined8 *)((this->m_colorBlendState).blendConstants + 2) =
       *(undefined8 *)(state->blendConstants + 2);
  (this->m_colorBlendState).flags = VVar5;
  (this->m_colorBlendState).logicOpEnable = VVar6;
  (this->m_colorBlendState).logicOp = VVar7;
  (this->m_colorBlendState).attachmentCount = dVar8;
  (this->m_colorBlendState).sType = VVar9;
  *(undefined4 *)&(this->m_colorBlendState).field_0x4 = uVar10;
  (this->m_colorBlendState).pNext = pvVar3;
  (this->m_colorBlendState).pAttachments =
       (this->m_colorBlendStateAttachments).
       super__Vector_base<vk::VkPipelineColorBlendAttachmentState,_std::allocator<vk::VkPipelineColorBlendAttachmentState>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_VkGraphicsPipelineCreateInfo).pColorBlendState = &this->m_colorBlendState;
  return this;
}

Assistant:

PipelineCreateInfo& PipelineCreateInfo::addState (const vk::VkPipelineColorBlendStateCreateInfo& state)
{
	m_colorBlendStateAttachments	= std::vector<vk::VkPipelineColorBlendAttachmentState>(state.pAttachments, state.pAttachments + state.attachmentCount);
	m_colorBlendState				= state;
	m_colorBlendState.pAttachments	= &m_colorBlendStateAttachments[0];
	pColorBlendState				= &m_colorBlendState;

	return *this;
}